

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O3

void write_flags(ang_file *fff,char *intro_text,bitflag *flags,int flag_size,char **names)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  int iVar4;
  char buf [1024];
  char local_438 [1032];
  
  iVar4 = 0;
  memset(local_438,0,0x400);
  iVar2 = flag_next(flags,(long)flag_size,1);
  if (iVar2 != 0) {
    cVar1 = '\0';
    do {
      if (cVar1 != '\0') {
        my_strcat(local_438," | ",0x400);
        iVar4 = iVar4 + 3;
      }
      if (names[iVar2] == (char *)0x0) break;
      my_strcat(local_438,names[iVar2],0x400);
      sVar3 = strlen(names[iVar2]);
      iVar4 = iVar4 + (int)sVar3;
      if (0x3b < iVar4) {
        iVar4 = 0;
        file_putf(fff,"%s%s\n",intro_text,local_438);
        my_strcpy(local_438,"",0x400);
      }
      iVar2 = flag_next(flags,(long)flag_size,iVar2 + 1);
      cVar1 = local_438[0];
    } while (iVar2 != 0);
    if (iVar4 != 0) {
      file_putf(fff,"%s%s\n",intro_text,local_438);
    }
  }
  return;
}

Assistant:

void write_flags(ang_file *fff, const char *intro_text, const bitflag *flags,
					   int flag_size, const char *names[])
{
	int flag;
	char buf[1024] = "";
	int pointer = 0;

	/* Write flag name list */
	for (flag = flag_next(flags, flag_size, FLAG_START); flag != FLAG_END;
		 flag = flag_next(flags, flag_size, flag + 1)) {

		/* Write the flags, keeping track of where we are */
		if (strlen(buf)) {
			my_strcat(buf, " | ", sizeof(buf));
			pointer += 3;
		}

		/* If no name, we're past the real flags */
		if (!names[flag]) break;
		my_strcat(buf, names[flag], sizeof(buf));
		pointer += strlen(names[flag]);

		/* Move to a new line if this one is long enough */
		if (pointer >= 60) {
			file_putf(fff, "%s%s\n", intro_text, buf);
			my_strcpy(buf, "", sizeof(buf));
			pointer = 0;
		}
	}

	/* Print remaining flags if any */
	if (pointer)
		file_putf(fff, "%s%s\n", intro_text, buf);
}